

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBlendTests.cpp
# Opt level: O2

int __thiscall deqp::gles3::Functional::BlendCase::init(BlendCase *this,EVP_PKEY_CTX *ctx)

{
  Vector<float,_4> *a;
  TextureFormat *pTVar1;
  undefined8 *puVar2;
  ostringstream *this_00;
  undefined8 *puVar3;
  ChannelOrder CVar4;
  int extraout_EAX;
  GLenum GVar5;
  int extraout_EAX_00;
  int iVar6;
  RenderTarget *pRVar7;
  undefined8 uVar8;
  QuadRenderer *this_01;
  ReferenceQuadRenderer *this_02;
  TextureLevel *this_03;
  MessageBuilder *pMVar9;
  int iVar10;
  long lVar11;
  tcu local_1f0 [16];
  Vector<float,_4> local_1e0;
  tcu local_1d0 [16];
  tcu local_1c0 [16];
  undefined1 local_1b0 [8];
  TextureFormat TStack_1a8;
  
  if (this->m_useSrgbFbo == false) {
    pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
    CVar4 = RGBA - ((pRVar7->m_pixelFormat).alphaBits == 0);
  }
  else {
    CVar4 = RGBA;
  }
  if (init()::baseGradientColors == '\0') {
    iVar6 = __cxa_guard_acquire(&init()::baseGradientColors);
    if (iVar6 != 0) {
      init::baseGradientColors[0].m_data[0] = _DAT_017fb160;
      init::baseGradientColors[0].m_data[1] = _UNK_017fb164;
      init::baseGradientColors[0].m_data[2] = _UNK_017fb168;
      init::baseGradientColors[0].m_data[3] = _UNK_017fb16c;
      init::baseGradientColors[1].m_data[0] = _DAT_017e4b80;
      init::baseGradientColors[1].m_data[1] = _UNK_017e4b84;
      init::baseGradientColors[1].m_data[2] = _UNK_017e4b88;
      init::baseGradientColors[1].m_data[3] = _UNK_017e4b8c;
      init::baseGradientColors[2].m_data[0] = _DAT_01815b20;
      init::baseGradientColors[2].m_data[1] = _UNK_01815b24;
      init::baseGradientColors[2].m_data[2] = _UNK_01815b28;
      init::baseGradientColors[2].m_data[3] = _UNK_01815b2c;
      init::baseGradientColors[3].m_data[0] = _DAT_018127f0;
      init::baseGradientColors[3].m_data[1] = _UNK_018127f4;
      init::baseGradientColors[3].m_data[2] = _UNK_018127f8;
      init::baseGradientColors[3].m_data[3] = _UNK_018127fc;
      __cxa_guard_release(&init()::baseGradientColors);
    }
  }
  for (lVar11 = 0; lVar11 != 0x40; lVar11 = lVar11 + 0x10) {
    a = (Vector<float,_4> *)((long)init::baseGradientColors[0].m_data + lVar11);
    tcu::operator-(local_1c0,a,0.5);
    tcu::operator*(local_1f0,0.2,(Vector<float,_4> *)local_1c0);
    tcu::operator+((tcu *)local_1b0,0.5,(Vector<float,_4> *)local_1f0);
    pTVar1 = (TextureFormat *)((long)(this->m_firstQuad).color[0].m_data + lVar11);
    pTVar1->order = local_1b0._0_4_;
    pTVar1->type = local_1b0._4_4_;
    pTVar1[1] = TStack_1a8;
    puVar2 = (undefined8 *)((long)(this->m_firstQuad).color[0].m_data + lVar11);
    uVar8 = puVar2[1];
    puVar3 = (undefined8 *)((long)(this->m_firstQuadInt).color[0].m_data + lVar11);
    *puVar3 = *puVar2;
    puVar3[1] = uVar8;
    tcu::Vector<float,_4>::Vector(&local_1e0,1.0);
    tcu::operator-(local_1d0,&local_1e0,a);
    tcu::operator-(local_1c0,(Vector<float,_4> *)local_1d0,0.5);
    tcu::operator*(local_1f0,1.0,(Vector<float,_4> *)local_1c0);
    tcu::operator+((tcu *)local_1b0,0.5,(Vector<float,_4> *)local_1f0);
    pTVar1 = (TextureFormat *)((long)(this->m_secondQuad).color[0].m_data + lVar11);
    pTVar1->order = local_1b0._0_4_;
    pTVar1->type = local_1b0._4_4_;
    pTVar1[1] = TStack_1a8;
    puVar2 = (undefined8 *)((long)(this->m_secondQuad).color[0].m_data + lVar11);
    uVar8 = puVar2[1];
    puVar3 = (undefined8 *)((long)(this->m_secondQuadInt).color[0].m_data + lVar11);
    *puVar3 = *puVar2;
    puVar3[1] = uVar8;
  }
  iVar6 = this->m_renderWidth;
  if (0x3f < this->m_renderWidth) {
    iVar6 = 0x40;
  }
  this->m_viewportWidth = iVar6;
  iVar10 = 0x40;
  if (this->m_renderHeight < 0x40) {
    iVar10 = this->m_renderHeight;
  }
  this->m_viewportHeight = iVar10;
  *(undefined8 *)(this->m_firstQuadInt).posA.m_data = 0;
  *(undefined8 *)(this->m_secondQuadInt).posA.m_data = 0;
  uVar8 = CONCAT44(iVar10 + -1,iVar6 + -1);
  *(undefined8 *)(this->m_firstQuadInt).posB.m_data = uVar8;
  *(undefined8 *)(this->m_secondQuadInt).posB.m_data = uVar8;
  this_01 = (QuadRenderer *)operator_new(0x20);
  deqp::gls::FragmentOpUtil::QuadRenderer::QuadRenderer
            (this_01,((this->super_TestCase).m_context)->m_renderCtx,GLSL_VERSION_300_ES);
  this->m_renderer = this_01;
  this_02 = (ReferenceQuadRenderer *)operator_new(0x11108);
  deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::ReferenceQuadRenderer(this_02);
  this->m_referenceRenderer = this_02;
  this_03 = (TextureLevel *)operator_new(0x28);
  if (this->m_useSrgbFbo != false) {
    CVar4 = sRGBA;
  }
  local_1b0._4_4_ = UNORM_INT8;
  local_1b0._0_4_ = CVar4;
  tcu::TextureLevel::TextureLevel
            (this_03,(TextureFormat *)local_1b0,this->m_viewportWidth,this->m_viewportHeight,1);
  this->m_refColorBuffer = this_03;
  this->m_curParamSetNdx = 0;
  iVar6 = extraout_EAX;
  if (this->m_useSrgbFbo == true) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Using FBO of size (");
    pMVar9 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&this->m_renderWidth);
    std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&this->m_renderHeight);
    std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    ") with format GL_SRGB8_ALPHA8");
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    glwGenRenderbuffers(1,&this->m_colorRbo);
    GVar5 = glwGetError();
    glu::checkError(GVar5,"glGenRenderbuffers(1, &m_colorRbo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                    ,0xd8);
    glwBindRenderbuffer(0x8d41,this->m_colorRbo);
    GVar5 = glwGetError();
    glu::checkError(GVar5,"glBindRenderbuffer(GL_RENDERBUFFER, m_colorRbo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                    ,0xd9);
    glwRenderbufferStorage(0x8d41,0x8c43,this->m_renderWidth,this->m_renderHeight);
    GVar5 = glwGetError();
    glu::checkError(GVar5,
                    "glRenderbufferStorage(GL_RENDERBUFFER, GL_SRGB8_ALPHA8, m_renderWidth, m_renderHeight)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                    ,0xda);
    glwGenFramebuffers(1,&this->m_fbo);
    GVar5 = glwGetError();
    glu::checkError(GVar5,"glGenFramebuffers(1, &m_fbo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                    ,0xdc);
    glwBindFramebuffer(0x8d40,this->m_fbo);
    GVar5 = glwGetError();
    glu::checkError(GVar5,"glBindFramebuffer(GL_FRAMEBUFFER, m_fbo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                    ,0xdd);
    glwFramebufferRenderbuffer(0x8d40,0x8ce0,0x8d41,this->m_colorRbo);
    GVar5 = glwGetError();
    glu::checkError(GVar5,
                    "glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_colorRbo)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                    ,0xde);
    iVar6 = extraout_EAX_00;
  }
  return iVar6;
}

Assistant:

void BlendCase::init (void)
{
	bool useRGB = !m_useSrgbFbo && m_context.getRenderTarget().getPixelFormat().alphaBits == 0;

	static const Vec4 baseGradientColors[4] =
	{
		Vec4(0.0f, 0.5f, 1.0f, 0.5f),
		Vec4(0.5f, 0.0f, 0.5f, 1.0f),
		Vec4(0.5f, 1.0f, 0.5f, 0.0f),
		Vec4(1.0f, 0.5f, 0.0f, 0.5f)
	};

	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(m_firstQuad.color) == DE_LENGTH_OF_ARRAY(m_firstQuadInt.color));
	for (int i = 0; i < DE_LENGTH_OF_ARRAY(m_firstQuad.color); i++)
	{
		m_firstQuad.color[i]		= (baseGradientColors[i] - 0.5f) * 0.2f + 0.5f;
		m_firstQuadInt.color[i]		= m_firstQuad.color[i];

		m_secondQuad.color[i]		= (Vec4(1.0f) - baseGradientColors[i] - 0.5f) * 1.0f + 0.5f;
		m_secondQuadInt.color[i]	= m_secondQuad.color[i];
	}

	m_viewportWidth		= de::min<int>(m_renderWidth,	MAX_VIEWPORT_WIDTH);
	m_viewportHeight	= de::min<int>(m_renderHeight,	MAX_VIEWPORT_HEIGHT);

	m_firstQuadInt.posA		= tcu::IVec2(0,						0);
	m_secondQuadInt.posA	= tcu::IVec2(0,						0);
	m_firstQuadInt.posB		= tcu::IVec2(m_viewportWidth-1,		m_viewportHeight-1);
	m_secondQuadInt.posB	= tcu::IVec2(m_viewportWidth-1,		m_viewportHeight-1);

	DE_ASSERT(!m_renderer);
	DE_ASSERT(!m_referenceRenderer);
	DE_ASSERT(!m_refColorBuffer);

	m_renderer				= new QuadRenderer(m_context.getRenderContext(), glu::GLSL_VERSION_300_ES);
	m_referenceRenderer		= new ReferenceQuadRenderer;
	m_refColorBuffer		= new TextureLevel(TextureFormat(m_useSrgbFbo ? TextureFormat::sRGBA : useRGB ? TextureFormat::RGB : TextureFormat::RGBA, TextureFormat::UNORM_INT8),
											   m_viewportWidth, m_viewportHeight);

	m_curParamSetNdx = 0;

	if (m_useSrgbFbo)
	{
		m_testCtx.getLog() << TestLog::Message << "Using FBO of size (" << m_renderWidth << ", " << m_renderHeight << ") with format GL_SRGB8_ALPHA8" << TestLog::EndMessage;

		GLU_CHECK_CALL(glGenRenderbuffers(1, &m_colorRbo));
		GLU_CHECK_CALL(glBindRenderbuffer(GL_RENDERBUFFER, m_colorRbo));
		GLU_CHECK_CALL(glRenderbufferStorage(GL_RENDERBUFFER, GL_SRGB8_ALPHA8, m_renderWidth, m_renderHeight));

		GLU_CHECK_CALL(glGenFramebuffers(1, &m_fbo));
		GLU_CHECK_CALL(glBindFramebuffer(GL_FRAMEBUFFER, m_fbo));
		GLU_CHECK_CALL(glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_colorRbo));
	}
}